

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::quadratic_cost_type<float>::make_l2_norm(quadratic_cost_type<float> *this,int n)

{
  float *pfVar1;
  float *pfVar2;
  quad *pqVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined8 uVar17;
  ulong uVar18;
  byte bVar19;
  byte bVar20;
  ulong uVar21;
  ulong uVar22;
  long unaff_RBX;
  ushort uVar23;
  undefined1 auVar25 [32];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar24 [32];
  
  if (n == 0) {
    auVar31 = ZEXT864(0);
  }
  else {
    auVar31 = ZEXT864(0);
    uVar21 = 0;
    do {
      pfVar2 = (this->linear_elements)._M_t.
               super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl + uVar21;
      uVar21 = uVar21 + 1;
      auVar32 = ZEXT416((uint)*pfVar2);
      auVar32 = vfmadd231ss_fma(auVar31._0_16_,auVar32,auVar32);
      auVar31 = ZEXT1664(auVar32);
    } while ((uint)n != uVar21);
  }
  auVar32 = auVar31._0_16_;
  uVar21 = (ulong)(uint)(this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>
                        ._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                        super__Head_base<0UL,_int_*,_false>._M_head_impl[n];
  if (uVar21 != 0) {
    uVar22 = 0;
    do {
      pqVar3 = (this->quadratic_elements)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
               .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>.
               _M_head_impl + uVar22;
      uVar22 = uVar22 + 1;
      auVar32 = ZEXT416((uint)pqVar3->factor);
      auVar32 = vfmadd231ss_fma(auVar31._0_16_,auVar32,auVar32);
      auVar31 = ZEXT1664(auVar32);
    } while (uVar21 != uVar22);
  }
  if ((auVar32._0_4_ & 0x7fffffff) - 0x800000 < 0x7f000000) {
    if (n != 0) {
      auVar31 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      pfVar2 = (this->linear_elements)._M_t.
               super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl;
      auVar27 = vbroadcastss_avx512f(auVar32);
      auVar28 = vpbroadcastq_avx512f();
      uVar22 = 0;
      do {
        auVar29 = vpbroadcastq_avx512f();
        auVar30 = vporq_avx512f(auVar29,auVar31);
        auVar29 = vporq_avx512f(auVar29,auVar26);
        uVar17 = vpcmpuq_avx512f(auVar29,auVar28,2);
        bVar19 = (byte)uVar17;
        uVar17 = vpcmpuq_avx512f(auVar30,auVar28,2);
        bVar20 = (byte)uVar17;
        uVar23 = CONCAT11(bVar20,bVar19);
        pfVar1 = pfVar2 + uVar22;
        auVar29._4_4_ = (uint)((byte)(uVar23 >> 1) & 1) * (int)pfVar1[1];
        auVar29._0_4_ = (uint)(bVar19 & 1) * (int)*pfVar1;
        auVar29._8_4_ = (uint)((byte)(uVar23 >> 2) & 1) * (int)pfVar1[2];
        auVar29._12_4_ = (uint)((byte)(uVar23 >> 3) & 1) * (int)pfVar1[3];
        auVar29._16_4_ = (uint)((byte)(uVar23 >> 4) & 1) * (int)pfVar1[4];
        auVar29._20_4_ = (uint)((byte)(uVar23 >> 5) & 1) * (int)pfVar1[5];
        auVar29._24_4_ = (uint)((byte)(uVar23 >> 6) & 1) * (int)pfVar1[6];
        auVar29._28_4_ = (uint)((byte)(uVar23 >> 7) & 1) * (int)pfVar1[7];
        auVar29._32_4_ = (uint)(bVar20 & 1) * (int)pfVar1[8];
        auVar29._36_4_ = (uint)(bVar20 >> 1 & 1) * (int)pfVar1[9];
        auVar29._40_4_ = (uint)(bVar20 >> 2 & 1) * (int)pfVar1[10];
        auVar29._44_4_ = (uint)(bVar20 >> 3 & 1) * (int)pfVar1[0xb];
        auVar29._48_4_ = (uint)(bVar20 >> 4 & 1) * (int)pfVar1[0xc];
        auVar29._52_4_ = (uint)(bVar20 >> 5 & 1) * (int)pfVar1[0xd];
        auVar29._56_4_ = (uint)(bVar20 >> 6 & 1) * (int)pfVar1[0xe];
        auVar29._60_4_ = (uint)(bVar20 >> 7) * (int)pfVar1[0xf];
        auVar29 = vdivps_avx512f(auVar29,auVar27);
        pfVar1 = pfVar2 + uVar22;
        bVar4 = (bool)((byte)(uVar23 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar23 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar23 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar23 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar23 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar23 >> 6) & 1);
        bVar10 = (bool)((byte)(uVar23 >> 7) & 1);
        bVar11 = (bool)(bVar20 >> 1 & 1);
        bVar12 = (bool)(bVar20 >> 2 & 1);
        bVar13 = (bool)(bVar20 >> 3 & 1);
        bVar14 = (bool)(bVar20 >> 4 & 1);
        bVar15 = (bool)(bVar20 >> 5 & 1);
        bVar16 = (bool)(bVar20 >> 6 & 1);
        *pfVar1 = (float)((uint)(bVar19 & 1) * auVar29._0_4_ |
                         (uint)!(bool)(bVar19 & 1) * (int)*pfVar1);
        pfVar1[1] = (float)((uint)bVar4 * auVar29._4_4_ | (uint)!bVar4 * (int)pfVar1[1]);
        pfVar1[2] = (float)((uint)bVar5 * auVar29._8_4_ | (uint)!bVar5 * (int)pfVar1[2]);
        pfVar1[3] = (float)((uint)bVar6 * auVar29._12_4_ | (uint)!bVar6 * (int)pfVar1[3]);
        pfVar1[4] = (float)((uint)bVar7 * auVar29._16_4_ | (uint)!bVar7 * (int)pfVar1[4]);
        pfVar1[5] = (float)((uint)bVar8 * auVar29._20_4_ | (uint)!bVar8 * (int)pfVar1[5]);
        pfVar1[6] = (float)((uint)bVar9 * auVar29._24_4_ | (uint)!bVar9 * (int)pfVar1[6]);
        pfVar1[7] = (float)((uint)bVar10 * auVar29._28_4_ | (uint)!bVar10 * (int)pfVar1[7]);
        pfVar1[8] = (float)((uint)(bVar20 & 1) * auVar29._32_4_ |
                           (uint)!(bool)(bVar20 & 1) * (int)pfVar1[8]);
        pfVar1[9] = (float)((uint)bVar11 * auVar29._36_4_ | (uint)!bVar11 * (int)pfVar1[9]);
        pfVar1[10] = (float)((uint)bVar12 * auVar29._40_4_ | (uint)!bVar12 * (int)pfVar1[10]);
        pfVar1[0xb] = (float)((uint)bVar13 * auVar29._44_4_ | (uint)!bVar13 * (int)pfVar1[0xb]);
        pfVar1[0xc] = (float)((uint)bVar14 * auVar29._48_4_ | (uint)!bVar14 * (int)pfVar1[0xc]);
        pfVar1[0xd] = (float)((uint)bVar15 * auVar29._52_4_ | (uint)!bVar15 * (int)pfVar1[0xd]);
        pfVar1[0xe] = (float)((uint)bVar16 * auVar29._56_4_ | (uint)!bVar16 * (int)pfVar1[0xe]);
        pfVar1[0xf] = (float)((uint)(bVar20 >> 7) * auVar29._60_4_ |
                             (uint)!(bool)(bVar20 >> 7) * (int)pfVar1[0xf]);
        uVar22 = uVar22 + 0x10;
      } while (((ulong)(uint)n + 0xf & 0x1fffffff0) != uVar22);
    }
    if (uVar21 != 0) {
      auVar31 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar27 = vpbroadcastq_avx512f(ZEXT816(0x10));
      pqVar3 = (this->quadratic_elements)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
               .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>.
               _M_head_impl;
      auVar28 = vbroadcastss_avx512f(auVar32);
      uVar21 = uVar21 + 0xf & 0x1fffffff0;
      auVar29 = vpbroadcastq_avx512f();
      do {
        uVar22 = vpcmpuq_avx512f(auVar31,auVar29,2);
        uVar18 = vpcmpuq_avx512f(auVar26,auVar29,2);
        uVar21 = uVar21 - 0x10;
        auVar24 = vgatherqps_avx512f(*(undefined8 *)((long)pqVar3 * 9));
        auVar25._8_8_ = (ulong)((byte)(uVar22 >> 1) & 1) * auVar24._8_8_;
        auVar25._0_8_ = (ulong)((byte)uVar22 & 1) * auVar24._0_8_;
        auVar25._16_8_ = (ulong)((byte)(uVar22 >> 2) & 1) * auVar24._16_8_;
        auVar25._24_8_ = (ulong)((byte)(uVar22 >> 3) & 1) * auVar24._24_8_;
        auVar24 = vgatherqps_avx512f(pqVar3[unaff_RBX]);
        auVar30 = vinsertf64x4_avx512f
                            (ZEXT3264(CONCAT824((ulong)((byte)(uVar18 >> 3) & 1) * auVar24._24_8_,
                                                CONCAT816((ulong)((byte)(uVar18 >> 2) & 1) *
                                                          auVar24._16_8_,
                                                          CONCAT88((ulong)((byte)(uVar18 >> 1) & 1)
                                                                   * auVar24._8_8_,
                                                                   (ulong)((byte)uVar18 & 1) *
                                                                   auVar24._0_8_)))),auVar25,1);
        auVar30 = vdivps_avx512f(auVar30,auVar28);
        vscatterqps_avx512f(ZEXT864(pqVar3) + auVar26 * (undefined1  [64])0x8,uVar18,auVar30._0_32_)
        ;
        auVar24 = vextractf64x4_avx512f(auVar30,1);
        auVar26 = vpaddq_avx512f(auVar26,auVar27);
        vscatterqps_avx512f(ZEXT864(pqVar3) + auVar31 * (undefined1  [64])0x8,uVar22,auVar24);
        auVar31 = vpaddq_avx512f(auVar31,auVar27);
      } while (uVar21 != 0);
    }
  }
  return;
}

Assistant:

void make_l2_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += linear_elements[i] * linear_elements[i];
        ;

        for (int i = 0, e = indices[n]; i != e; ++i)
            div += quadratic_elements[i].factor * quadratic_elements[i].factor;

        if (std::isnormal(div)) {
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;

            for (int i = 0, e = indices[n]; i != e; ++i)
                quadratic_elements[i].factor /= div;
        }
    }